

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O0

size_t __thiscall GrcErrorList::NumberOfWarningsGiven(GrcErrorList *this)

{
  bool bVar1;
  GrcErrorList *this_00;
  GrcErrorList *pGVar2;
  GrcErrorList *in_RDI;
  uint ierr;
  int cerrRet;
  int in_stack_ffffffffffffffdc;
  uint local_10;
  int nWarning;
  GrcErrorList *this_01;
  
  nWarning = 0;
  local_10 = 0;
  this_01 = in_RDI;
  while( true ) {
    this_00 = (GrcErrorList *)(ulong)local_10;
    pGVar2 = (GrcErrorList *)
             std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::size(&in_RDI->m_vperr);
    if (pGVar2 <= this_00) break;
    bVar1 = IsFatal(this_00,in_stack_ffffffffffffffdc);
    if (!bVar1) {
      std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::operator[]
                (&in_RDI->m_vperr,(ulong)local_10);
      bVar1 = IgnoreWarning(this_01,nWarning);
      if (!bVar1) {
        nWarning = nWarning + 1;
      }
    }
    local_10 = local_10 + 1;
  }
  return (long)nWarning;
}

Assistant:

size_t GrcErrorList::NumberOfWarningsGiven()
{
	int cerrRet = 0;
	for (auto ierr = 0U; ierr < m_vperr.size(); ++ierr)
	{
		if (!IsFatal(ierr) && !IgnoreWarning(m_vperr[ierr]->m_nID))
			cerrRet++;
	}
	return cerrRet;
}